

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

char __thiscall CheaterBotStrategy::yesOrNo(CheaterBotStrategy *this,StrategyContext context)

{
  int iVar1;
  StrategyContext context_local;
  CheaterBotStrategy *this_local;
  
  if (context == ATTACK) {
    iVar1 = cheaterAttack(this);
    this_local._7_1_ = (char)iVar1;
  }
  else if (context == FORTIFY) {
    iVar1 = cheaterFortify(this);
    this_local._7_1_ = (char)iVar1;
  }
  else if (context == REINFORCE) {
    iVar1 = cheaterReinforce(this);
    this_local._7_1_ = (char)iVar1;
  }
  else {
    this_local._7_1_ = -1;
  }
  return this_local._7_1_;
}

Assistant:

signed char CheaterBotStrategy::yesOrNo(StrategyContext context) {
    switch (context) {
        case ATTACK:
            return (signed char) this->cheaterAttack();
        case REINFORCE:
            return (signed char) this->cheaterReinforce();
        case FORTIFY:
            return (signed char) this->cheaterFortify();
        default:
            return -1;
    }
}